

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall
MeCab::EncoderFeatureIndex::reopen
          (EncoderFeatureIndex *this,char *filename,char *dic_charset,
          vector<double,_std::allocator<double>_> *alpha,Param *param)

{
  uint uVar1;
  pointer pdVar2;
  char *key;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_t sVar6;
  ostream *poVar7;
  scoped_fixed_array<char,_8192> buf;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_2f8;
  vector<double,_std::allocator<double>_> *local_2d0;
  Iconv iconv;
  string model_charset;
  char *column [8];
  string feature;
  ifstream ifs;
  uint auStack_218 [122];
  
  (*(this->super_FeatureIndex)._vptr_FeatureIndex[2])();
  std::ifstream::ifstream(&ifs,filename,_S_in);
  uVar1 = *(uint *)((long)auStack_218 + *(long *)(_ifs + -0x18));
  if ((uVar1 & 5) == 0) {
    buf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_00138e90;
    local_2d0 = alpha;
    buf.ptr_ = (char *)operator_new__(0x2000);
    buf.size_ = 0x2000;
    model_charset._M_dataplus._M_p = (pointer)&model_charset.field_2;
    model_charset._M_string_length = 0;
    model_charset.field_2._M_local_buf[0] = '\0';
    while ((plVar5 = (long *)std::istream::getline((char *)&ifs,(long)buf.ptr_),
           (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0 &&
           (*buf.ptr_ != '\0'))) {
      sVar6 = tokenize2<char**>(buf.ptr_,":",column,2);
      if (sVar6 != 2) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        poVar7 = std::operator<<(poVar7,"(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x27b);
        poVar7 = std::operator<<(poVar7,") [");
        poVar7 = std::operator<<(poVar7,"tokenize2(buf.get(), \":\", column, 2) == 2");
        poVar7 = std::operator<<(poVar7,"] ");
        poVar7 = std::operator<<(poVar7,"format error: ");
        std::operator<<(poVar7,buf.ptr_);
        die::~die((die *)&local_2f8);
      }
      std::__cxx11::string::string((string *)&local_2f8,column[0],(allocator *)&feature);
      bVar3 = std::operator==(&local_2f8.first,"charset");
      std::__cxx11::string::~string((string *)&local_2f8);
      key = column[0];
      if (bVar3) {
        std::__cxx11::string::assign((char *)&model_charset);
      }
      else {
        std::__cxx11::string::string((string *)&local_2f8,column[1] + 1,(allocator *)&feature);
        Param::set<std::__cxx11::string>(param,key,&local_2f8.first,true);
        std::__cxx11::string::~string((string *)&local_2f8);
      }
    }
    if (dic_charset == (char *)0x0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x284);
      poVar7 = std::operator<<(poVar7,") [");
      poVar7 = std::operator<<(poVar7,"dic_charset");
      std::operator<<(poVar7,"] ");
      die::~die((die *)&local_2f8);
    }
    if (model_charset._M_string_length == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x285);
      poVar7 = std::operator<<(poVar7,") [");
      poVar7 = std::operator<<(poVar7,"!model_charset.empty()");
      poVar7 = std::operator<<(poVar7,"] ");
      std::operator<<(poVar7,"charset is empty");
      die::~die((die *)&local_2f8);
    }
    Iconv::Iconv(&iconv);
    iVar4 = Iconv::open(&iconv,model_charset._M_dataplus._M_p,(int)dic_charset);
    if ((char)iVar4 == '\0') {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x288);
      poVar7 = std::operator<<(poVar7,") [");
      poVar7 = std::operator<<(poVar7,"iconv.open(model_charset.c_str(), dic_charset)");
      poVar7 = std::operator<<(poVar7,"] ");
      poVar7 = std::operator<<(poVar7,"cannot create model from=");
      poVar7 = std::operator<<(poVar7,(string *)&model_charset);
      poVar7 = std::operator<<(poVar7," to=");
      std::operator<<(poVar7,dic_charset);
      die::~die((die *)&local_2f8);
    }
    pdVar2 = (local_2d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((local_2d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish != pdVar2) {
      (local_2d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = pdVar2;
    }
    if ((this->super_FeatureIndex).maxid_ != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x28d);
      poVar7 = std::operator<<(poVar7,") [");
      poVar7 = std::operator<<(poVar7,"maxid_ == 0");
      std::operator<<(poVar7,"] ");
      die::~die((die *)&local_2f8);
    }
    if ((this->dic_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x28e);
      poVar7 = std::operator<<(poVar7,") [");
      poVar7 = std::operator<<(poVar7,"dic_.empty()");
      std::operator<<(poVar7,"] ");
      die::~die((die *)&local_2f8);
    }
    while (plVar5 = (long *)std::istream::getline((char *)&ifs,(long)buf.ptr_),
          (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
      sVar6 = tokenize2<char**>(buf.ptr_,"\t",column,2);
      if (sVar6 != 2) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        poVar7 = std::operator<<(poVar7,"(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x291);
        poVar7 = std::operator<<(poVar7,") [");
        poVar7 = std::operator<<(poVar7,"tokenize2(buf.get(), \"\\t\", column, 2) == 2");
        poVar7 = std::operator<<(poVar7,"] ");
        poVar7 = std::operator<<(poVar7,"format error: ");
        std::operator<<(poVar7,buf.ptr_);
        die::~die((die *)&local_2f8);
      }
      std::__cxx11::string::string((string *)&feature,column[1],(allocator *)&local_2f8);
      bVar3 = Iconv::convert(&iconv,&feature);
      if (!bVar3) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        poVar7 = std::operator<<(poVar7,"(");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x294);
        poVar7 = std::operator<<(poVar7,") [");
        poVar7 = std::operator<<(poVar7,"iconv.convert(&feature)");
        std::operator<<(poVar7,"] ");
        die::~die((die *)&local_2f8);
      }
      sVar6 = (this->super_FeatureIndex).maxid_;
      (this->super_FeatureIndex).maxid_ = sVar6 + 1;
      std::__cxx11::string::string((string *)&local_2f8,(string *)&feature);
      local_2f8.second = sVar6;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_long>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  *)&this->dic_,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_2f8.first._M_dataplus._M_p = (pointer)atof(column[0]);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_2d0,(double *)&local_2f8);
      std::__cxx11::string::~string((string *)&feature);
    }
    Iconv::~Iconv(&iconv);
    std::__cxx11::string::~string((string *)&model_charset);
    scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
  }
  std::ifstream::~ifstream(&ifs);
  return (uVar1 & 5) == 0;
}

Assistant:

bool EncoderFeatureIndex::reopen(const char *filename,
                                 const char *dic_charset,
                                 std::vector<double> *alpha,
                                 Param *param) {
  close();
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    return false;
  }

  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[8];

  std::string model_charset;

  while (ifs.getline(buf.get(), buf.size())) {
    if (std::strlen(buf.get()) == 0) {
      break;
    }
    CHECK_DIE(tokenize2(buf.get(), ":", column, 2) == 2)
        << "format error: " << buf.get();
    if (std::string(column[0]) == "charset") {
      model_charset = column[1] + 1;
    } else {
      param->set<std::string>(column[0], column[1] + 1, true);
    }
  }

  CHECK_DIE(dic_charset);
  CHECK_DIE(!model_charset.empty()) << "charset is empty";

  Iconv iconv;
  CHECK_DIE(iconv.open(model_charset.c_str(), dic_charset))
      << "cannot create model from=" << model_charset
      << " to=" << dic_charset;

  alpha->clear();
  CHECK_DIE(maxid_ == 0);
  CHECK_DIE(dic_.empty());

  while (ifs.getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t", column, 2) == 2)
        << "format error: " << buf.get();
    std::string feature = column[1];
    CHECK_DIE(iconv.convert(&feature));
    dic_.insert(std::make_pair(feature, maxid_++));
    alpha->push_back(atof(column[0]));
  }

  return true;
}